

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMModule.c
# Opt level: O0

cs_err option(cs_struct *handle,cs_opt_type type,size_t value)

{
  size_t value_local;
  cs_opt_type type_local;
  cs_struct *handle_local;
  
  if (type == CS_OPT_SYNTAX) {
    if (value < 2) {
      handle->printer = X86_Intel_printInst;
      handle->syntax = 1;
    }
    else {
      if (value != 2) {
        handle->errnum = CS_ERR_OPTION;
        return CS_ERR_OPTION;
      }
      handle->printer = X86_ATT_printInst;
      handle->syntax = 2;
    }
  }
  else if (type == CS_OPT_MODE) {
    if (value == 8) {
      handle->regsize_map = regsize_map_64;
    }
    else {
      handle->regsize_map = regsize_map_32;
    }
    handle->mode = (cs_mode)value;
  }
  return CS_ERR_OK;
}

Assistant:

static cs_err option(cs_struct *handle, cs_opt_type type, size_t value)
{
	switch(type) {
		case CS_OPT_MODE:
			if (value & CS_MODE_THUMB)
				handle->disasm = Thumb_getInstruction;
			else
				handle->disasm = ARM_getInstruction;

			handle->mode = value;
			break;
		case CS_OPT_SYNTAX:
			ARM_getRegName(handle, (int)value);
			handle->syntax = (int)value;
			break;
		default:
			break;
	}

	return CS_ERR_OK;
}